

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::mark_clauses_to_be_flushed(Internal *this)

{
  uint64_t uVar1;
  bool bVar2;
  iterator this_00;
  Clause *c_00;
  vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *in_RDI;
  uint used;
  Clause **c;
  iterator __end1;
  iterator __begin1;
  vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *__range1;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
  local_18;
  vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *local_10;
  
  local_10 = in_RDI + 0x5c;
  local_18._M_current =
       (Clause **)std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::begin(in_RDI);
  this_00 = std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::end(in_RDI);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                             *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            (__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                             *)in_RDI), bVar2) {
    c_00 = (Clause *)
           __gnu_cxx::
           __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
           ::operator*(&local_18);
    if ((((*(uint *)((c_00->field_0).id + 8) >> 0xb & 1) != 0) &&
        ((*(uint *)((c_00->field_0).id + 8) >> 4 & 1) == 0)) &&
       ((*(uint *)((c_00->field_0).id + 8) >> 10 & 1) == 0)) {
      in_stack_ffffffffffffffd4 = *(uint *)((c_00->field_0).id + 8) >> 0xe & 3;
      if (in_stack_ffffffffffffffd4 == 0) {
        mark_garbage((Internal *)this_00._M_current,c_00);
        if ((*(uint *)((c_00->field_0).id + 8) >> 6 & 1) == 0) {
          in_RDI[0xba].super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)in_RDI[0xba].
                               super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        else {
          in_RDI[0xbb].super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)((long)in_RDI[0xbb].
                               super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1);
        }
      }
      else {
        uVar1 = (c_00->field_0).id;
        *(uint *)(uVar1 + 8) =
             *(uint *)(uVar1 + 8) & 0xffff3fff | ((*(uint *)(uVar1 + 8) >> 0xe & 3) - 1 & 3) << 0xe;
      }
    }
    __gnu_cxx::
    __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void Internal::mark_clauses_to_be_flushed () {
  for (const auto &c : clauses) {
    if (!c->redundant)
      continue; // keep irredundant
    if (c->garbage)
      continue; // already marked as garbage
    if (c->reason)
      continue; // need to keep reasons
    const unsigned used = c->used;
    if (used)
      c->used--;
    if (used)
      continue;       // but keep recently used clauses
    mark_garbage (c); // flush unused clauses
    if (c->hyper)
      stats.flush.hyper++;
    else
      stats.flush.learned++;
  }
  // No change to 'lim.kept{size,glue}'.
}